

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

ModportItemSyntax * __thiscall slang::parsing::Parser::parseModportItem(Parser *this)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  undefined8 uVar4;
  MemberSyntax *pMVar5;
  undefined4 extraout_var;
  AnsiPortListSyntax *ports;
  ModportItemSyntax *pMVar6;
  Info *src;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  TokenKind kind;
  ulong uVar7;
  Token name;
  Token current;
  Token TVar8;
  Token TVar9;
  Token closeParen;
  Token openParen;
  Token local_220;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_210;
  undefined1 local_200;
  Info *local_1f8;
  undefined8 local_1f0;
  Token local_1e8;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  name = ParserBase::expect(&this->super_ParserBase,Identifier);
  Token::Token(&local_1e8);
  Token::Token(&local_220);
  local_1e8 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if ((local_1e8._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&local_1e8);
    local_220 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar3);
    auStack_1b0._8_8_ = (Info *)0x0;
    auStack_1b0._16_8_ = (pointer)0x0;
    goto LAB_003b12a5;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  local_1f8 = name.info;
  local_1f0 = name._0_8_;
  current = ParserBase::peek(&this->super_ParserBase);
  local_1d8 = current;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(current.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_1d8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x460005,SVar3);
    }
LAB_003b1126:
    local_220 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    src = local_220.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleModportPort(current.kind);
    if (bVar1) {
      local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseModportPort(this)
      ;
      local_200 = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                 (TokenOrSyntax *)&local_210._M_first);
      TVar8 = ParserBase::peek(&this->super_ParserBase);
      uVar4 = TVar8._0_8_;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8.kind);
      if (TVar8.kind != EndOfFile && !bVar1) {
        do {
          if ((short)uVar4 != 0x18) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleModportPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x460005,false);
              if (!bVar1) goto LAB_003b1126;
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_210._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_200 = 0;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar8 = ParserBase::peek(&this->super_ParserBase);
          kind = TVar8.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(kind);
          if (kind == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          if ((current.info == TVar8.info && current.kind == kind) &&
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleModportPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x460005,true), !bVar1)) break;
          pMVar5 = parseModportPort(this);
          local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar5;
          local_200 = 1;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          uVar4 = TVar9._0_8_;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
          uVar7 = TVar8._0_8_ & 0xffffffff;
          current.info = TVar8.info;
          current.kind = (short)uVar7;
          current._2_1_ = (char)(uVar7 >> 0x10);
          current.numFlags.raw = (char)(uVar7 >> 0x18);
          current.rawLen = (int)(uVar7 >> 0x20);
        } while (TVar9.kind != EndOfFile && !bVar1);
      }
      goto LAB_003b1126;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,current,CloseParenthesis,&local_220,(DiagCode)0x460005);
    src = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  auStack_1b0._16_8_ = CONCAT44(extraout_var,iVar2);
  name.info = local_1f8;
  name.kind = (undefined2)local_1f0;
  name._2_1_ = local_1f0._2_1_;
  name.numFlags.raw = local_1f0._3_1_;
  name.rawLen = local_1f0._4_4_;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
  auStack_1b0._8_8_ = extraout_RDX_00;
LAB_003b12a5:
  local_1c8._8_4_ = 3;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_1c8._0_8_ = &PTR_getChild_005cb418;
  local_198._M_extent_value = auStack_1b0._8_8_;
  ports = slang::syntax::SyntaxFactory::ansiPortList
                    (&this->factory,local_1e8,
                     (SeparatedSyntaxList<slang::syntax::MemberSyntax> *)local_1c8,local_220);
  pMVar6 = slang::syntax::SyntaxFactory::modportItem(&this->factory,name,ports);
  return pMVar6;
}

Assistant:

ModportItemSyntax& Parser::parseModportItem() {
    auto name = expect(TokenKind::Identifier);

    Token openParen, closeParen;
    std::span<TokenOrSyntax> items;
    parseList<isPossibleModportPort, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, items,
        closeParen, RequireItems::True, diag::ExpectedModportPort,
        [this] { return &parseModportPort(); });

    auto& ports = factory.ansiPortList(openParen, items, closeParen);
    return factory.modportItem(name, ports);
}